

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keyexpimp.c
# Opt level: O3

int magma_wrap_do(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  int iVar2;
  uchar *iv;
  size_t expkeylen;
  
  iv = (uchar *)EVP_CIPHER_CTX_get_cipher_data();
  iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
  if (out == (uchar *)0x0) {
    iVar2 = 0x20;
  }
  else {
    expkeylen = *(size_t *)(iv + 0x78);
    if (inl < 0x29) {
      if (0x28 < expkeylen + inl) {
        return -1;
      }
      memcpy(iv + expkeylen + 0x48,in,inl);
      expkeylen = inl + *(long *)(iv + 0x78);
      *(size_t *)(iv + 0x78) = expkeylen;
    }
    iVar2 = (expkeylen < 0x28) - 1;
    if ((0x27 < expkeylen) && (iVar1 == 0)) {
      iVar1 = gost_kimp15(iv + 0x48,expkeylen,0x4a4,iv + 0x28,0x4a8,iv + 8,iv,4,out);
      iVar2 = (uint)(iVar1 != 0) << 5;
    }
  }
  return iVar2;
}

Assistant:

static int magma_wrap_do(EVP_CIPHER_CTX *ctx, unsigned char *out,
	const unsigned char *in, size_t inl)
{
	GOST_WRAP_CTX *cctx = EVP_CIPHER_CTX_get_cipher_data(ctx);
	int enc = EVP_CIPHER_CTX_encrypting(ctx) ? 1 : 0;

	if (out == NULL)
		return GOSTKEYLEN;

	if (inl <= MAGMA_WRAPPED_KEY_LEN) {
		if (cctx->wrap_count + inl > MAGMA_WRAPPED_KEY_LEN)
			return -1;

		if (cctx->wrap_count + inl <= MAGMA_WRAPPED_KEY_LEN)
		{
			memcpy(cctx->wrapped+cctx->wrap_count, in, inl);
			cctx->wrap_count += inl;
		}
	}

	if (cctx->wrap_count < MAGMA_WRAPPED_KEY_LEN)
		return 0;

	if (enc) {
#if 0
		return gost_kexp15(cctx->key, 32, NID_magma_ctr, in, NID_magma_mac,
			cctx->key, /* FIXME mac_key, */ cctx->iv, 4, out, &outl);
#endif
		return -1;
	} else {
		return gost_kimp15(cctx->wrapped, cctx->wrap_count, NID_magma_ctr,
		cctx->key+GOSTKEYLEN, NID_magma_mac, cctx->key, cctx->iv, 4, out) > 0 ? GOSTKEYLEN : 0;
	}
}